

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaDeviceMemoryBlock::Unmap(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,uint32_t count)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  if (count == 0) {
    return;
  }
  bVar2 = hAllocator->m_UseMutex;
  if ((bVar2 == true) &&
     (iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_MapAndBindMutex), iVar5 != 0)) {
    std::__throw_system_error(iVar5);
  }
  uVar7 = this->m_MapCount - count;
  if (count <= this->m_MapCount) {
    this->m_MapCount = uVar7;
    uVar6 = (this->m_MappingHysteresis).m_ExtraMapping;
    if (uVar7 + uVar6 == 0) {
      this->m_pMappedData = (void *)0x0;
      (*(hAllocator->m_VulkanFunctions).vkUnmapMemory)(hAllocator->m_hDevice,this->m_hMemory);
      uVar6 = (this->m_MappingHysteresis).m_ExtraMapping;
    }
    if (uVar6 == 0) {
      puVar1 = &(this->m_MappingHysteresis).m_MajorCounter;
      *puVar1 = *puVar1 + 1;
    }
    else {
      uVar3 = (this->m_MappingHysteresis).m_MinorCounter;
      uVar4 = (this->m_MappingHysteresis).m_MajorCounter;
      iVar5 = 1;
      if (uVar4 <= uVar3) {
        if (uVar4 == 0) goto LAB_001bab0a;
        (this->m_MappingHysteresis).m_MajorCounter = uVar4 - 1;
        iVar5 = -1;
      }
      (this->m_MappingHysteresis).m_MinorCounter = iVar5 + uVar3;
    }
  }
LAB_001bab0a:
  if (bVar2 == false) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_MapAndBindMutex);
  return;
}

Assistant:

void VmaDeviceMemoryBlock::Unmap(VmaAllocator hAllocator, uint32_t count)
{
    if (count == 0)
    {
        return;
    }

    VmaMutexLock lock(m_MapAndBindMutex, hAllocator->m_UseMutex);
    if (m_MapCount >= count)
    {
        m_MapCount -= count;
        const uint32_t totalMapCount = m_MapCount + m_MappingHysteresis.GetExtraMapping();
        if (totalMapCount == 0)
        {
            m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(hAllocator->m_hDevice, m_hMemory);
        }
        m_MappingHysteresis.PostUnmap();
    }
    else
    {
        VMA_ASSERT(0 && "VkDeviceMemory block is being unmapped while it was not previously mapped.");
    }
}